

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int sam_read1(htsFile *fp,bam_hdr_t *h,bam1_t *b)

{
  kstring_t *str;
  htsExactFormat hVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bam1_t *local_38;
  
  hVar1 = (fp->format).format;
  local_38 = b;
  if (hVar1 == cram) {
    iVar3 = cram_get_bam_seq((fp->fp).cram,&local_38);
  }
  else if (hVar1 == bam) {
    iVar4 = bam_read1((fp->fp).bgzf,b);
    iVar3 = iVar4;
    if (-1 < iVar4) {
      iVar2 = (local_38->core).tid;
      iVar3 = -3;
      if ((-2 < iVar2 && iVar2 < h->n_targets) &&
         (iVar2 = (local_38->core).mtid, iVar3 = iVar4, iVar2 < -1 || h->n_targets <= iVar2)) {
        iVar3 = -3;
      }
    }
  }
  else {
    if (hVar1 != sam) {
      abort();
    }
    str = &fp->line;
    do {
      if ((str->l == 0) && (iVar3 = hts_getline(fp,2,str), iVar3 < 0)) {
        return -1;
      }
      iVar3 = sam_parse1(str,h,local_38);
      str->l = 0;
      if (-1 < iVar3) {
        return iVar3;
      }
      if (0 < hts_verbose) {
        sam_read1_cold_1();
      }
    } while (h->ignore_sam_err != 0);
  }
  return iVar3;
}

Assistant:

int sam_read1(htsFile *fp, bam_hdr_t *h, bam1_t *b)
{
    switch (fp->format.format) {
    case bam: {
        int r = bam_read1(fp->fp.bgzf, b);
        if (r >= 0) {
            if (b->core.tid  >= h->n_targets || b->core.tid  < -1 ||
                b->core.mtid >= h->n_targets || b->core.mtid < -1)
                return -3;
        }
        return r;
        }

    case cram:
        return cram_get_bam_seq(fp->fp.cram, &b);

    case sam: {
        int ret;
err_recover:
        if (fp->line.l == 0) {
            ret = hts_getline(fp, KS_SEP_LINE, &fp->line);
            if (ret < 0) return -1;
        }
        ret = sam_parse1(&fp->line, h, b);
        fp->line.l = 0;
        if (ret < 0) {
            if (hts_verbose >= 1)
                fprintf(stderr, "[W::%s] parse error at line %lld\n", __func__, (long long)fp->lineno);
            if (h->ignore_sam_err) goto err_recover;
        }
        return ret;
        }

    default:
        abort();
    }
}